

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

ClassForm Event::parseClassForm(string *inp)

{
  bool bVar1;
  ClassForm CVar2;
  invalid_argument *this;
  
  bVar1 = std::operator==(inp,"lecture");
  CVar2 = Lecture;
  if (!bVar1) {
    bVar1 = std::operator==(inp,"tutorial");
    if (bVar1) {
      CVar2 = Tutorial;
    }
    else {
      bVar1 = std::operator==(inp,"laboratory");
      if (!bVar1) {
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this,"Invalid class type");
        __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
      }
      CVar2 = Laboratory;
    }
  }
  return CVar2;
}

Assistant:

static ClassForm parseClassForm(const string &inp) {
        if (inp == "lecture")
            return ClassForm::Lecture;
        else if (inp == "tutorial")
            return ClassForm::Tutorial;
        else if (inp == "laboratory")
            return ClassForm::Laboratory;
        throw invalid_argument("Invalid class type");
    }